

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::WindowDataParameter::InternalSerializeWithCachedSizesToArray
          (WindowDataParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.WindowDataParameter.source");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->source_).ptr_,target);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,this->scale_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->mean_file_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.WindowDataParameter.mean_file");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (3,(this->mean_file_).ptr_,target);
  }
  if ((uVar1 & 0x10) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (4,this->batch_size_,target);
  }
  if ((uVar1 & 0x20) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (5,this->crop_size_,target);
  }
  if ((uVar1 & 0x40) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(6,this->mirror_,target);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (7,this->fg_threshold_,target);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (8,this->bg_threshold_,target);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (9,this->fg_fraction_,target);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (10,this->context_pad_,target);
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->crop_mode_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.WindowDataParameter.crop_mode");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0xb,(this->crop_mode_).ptr_,target);
  }
  if ((char)uVar1 < '\0') {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0xc,this->cache_images_,target);
  }
  if ((uVar1 & 8) != 0) {
    psVar2 = (this->root_folder_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.WindowDataParameter.root_folder");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0xd,(this->root_folder_).ptr_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = WindowDataParameter::unknown_fields(this);
  puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* WindowDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.WindowDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->source(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->mean_file(), target);
  }

  // optional uint32 batch_size = 4;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4, this->batch_size(), target);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->crop_size(), target);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->mirror(), target);
  }

  // optional float fg_threshold = 7 [default = 0.5];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(7, this->fg_threshold(), target);
  }

  // optional float bg_threshold = 8 [default = 0.5];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(8, this->bg_threshold(), target);
  }

  // optional float fg_fraction = 9 [default = 0.25];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(9, this->fg_fraction(), target);
  }

  // optional uint32 context_pad = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->context_pad(), target);
  }

  // optional string crop_mode = 11 [default = "warp"];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->crop_mode().data(), this->crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.crop_mode");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->crop_mode(), target);
  }

  // optional bool cache_images = 12 [default = false];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(12, this->cache_images(), target);
  }

  // optional string root_folder = 13 [default = ""];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.root_folder");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        13, this->root_folder(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.WindowDataParameter)
  return target;
}